

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O1

RtMidiApi rtmidi_out_get_current_api(RtMidiPtr device)

{
  RtMidiApi RVar1;
  
  RVar1 = (**(code **)(**(long **)((long)device->ptr + 8) + 0x10))();
  return RVar1;
}

Assistant:

enum RtMidiApi rtmidi_out_get_current_api (RtMidiPtr device)
{
    try {
        return (RtMidiApi) ((RtMidiOut*) device->ptr)->getCurrentApi ();

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();

        return RTMIDI_API_UNSPECIFIED;
    }
}